

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantity.cpp
# Opt level: O2

void __thiscall
polyscope::Quantity::Quantity(Quantity *this,string *name_,Structure *parentStructure_)

{
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  (this->super_ManagedBufferRegistry).managedBufferMap_uvec2.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uvec2.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uvec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uvec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uvec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uvec4.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uvec4.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uvec4.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uint32.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::allocator<polyscope::render::ManagedBuffer<unsigned_int>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uint32.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::allocator<polyscope::render::ManagedBuffer<unsigned_int>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uint32.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::allocator<polyscope::render::ManagedBuffer<unsigned_int>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_int32.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<int>_*,_std::allocator<polyscope::render::ManagedBuffer<int>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_int32.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<int>_*,_std::allocator<polyscope::render::ManagedBuffer<int>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_int32.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<int>_*,_std::allocator<polyscope::render::ManagedBuffer<int>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uvec2.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uvec2.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_arr2vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_*,_std::allocator<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_arr2vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_*,_std::allocator<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_arr3vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>_>_*,_std::allocator<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_arr3vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>_>_*,_std::allocator<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_arr3vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>_>_*,_std::allocator<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_arr4vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>_>_*,_std::allocator<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_arr4vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>_>_*,_std::allocator<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_arr4vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>_>_*,_std::allocator<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_vec2.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_vec4.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<4,_float,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<4,_float,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_vec4.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<4,_float,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<4,_float,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_vec4.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<4,_float,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<4,_float,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_arr2vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_*,_std::allocator<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_float.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<float>_*,_std::allocator<polyscope::render::ManagedBuffer<float>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_float.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<float>_*,_std::allocator<polyscope::render::ManagedBuffer<float>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_float.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<float>_*,_std::allocator<polyscope::render::ManagedBuffer<float>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_double.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<double>_*,_std::allocator<polyscope::render::ManagedBuffer<double>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_double.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<double>_*,_std::allocator<polyscope::render::ManagedBuffer<double>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_double.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<double>_*,_std::allocator<polyscope::render::ManagedBuffer<double>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_vec2.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_vec2.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->_vptr_Quantity = (_func_int **)&PTR__Quantity_0059a108;
  this->parent = parentStructure_;
  std::__cxx11::string::string((string *)&this->name,(string *)name_);
  uniquePrefix_abi_cxx11_(&local_60,this);
  std::operator+(&local_40,&local_60,"enabled");
  PersistentValue<bool>::PersistentValue(&this->enabled,&local_40,false);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  validateName(&this->name);
  return;
}

Assistant:

Quantity::Quantity(std::string name_, Structure& parentStructure_)
    : parent(parentStructure_), name(name_), enabled(uniquePrefix() + "enabled", false) {
  validateName(name);
}